

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void luaK_dischargevars(FuncState *fs,expdesc *e)

{
  int iVar1;
  OpCode o;
  int c;
  
  switch(e->k) {
  case VLOCAL:
    e->k = VNONRELOC;
    return;
  case VUPVAL:
    iVar1 = (e->u).s.info;
    o = OP_GETUPVAL;
    c = 0;
    break;
  case VGLOBAL:
    iVar1 = luaK_codeABx(fs,OP_GETGLOBAL,0,(e->u).s.info);
    goto LAB_0010c4f0;
  case VINDEXED:
    freereg(fs,(e->u).s.aux);
    freereg(fs,(e->u).s.info);
    iVar1 = (e->u).s.info;
    c = (e->u).s.aux;
    o = OP_GETTABLE;
    break;
  default:
    goto switchD_0010c488_caseD_a;
  case VCALL:
  case VVARARG:
    luaK_setoneret(fs,e);
    return;
  }
  iVar1 = luaK_codeABC(fs,o,0,iVar1,c);
LAB_0010c4f0:
  (e->u).s.info = iVar1;
  e->k = VRELOCABLE;
switchD_0010c488_caseD_a:
  return;
}

Assistant:

static void luaK_dischargevars(FuncState*fs,expdesc*e){
switch(e->k){
case VLOCAL:{
e->k=VNONRELOC;
break;
}
case VUPVAL:{
e->u.s.info=luaK_codeABC(fs,OP_GETUPVAL,0,e->u.s.info,0);
e->k=VRELOCABLE;
break;
}
case VGLOBAL:{
e->u.s.info=luaK_codeABx(fs,OP_GETGLOBAL,0,e->u.s.info);
e->k=VRELOCABLE;
break;
}
case VINDEXED:{
freereg(fs,e->u.s.aux);
freereg(fs,e->u.s.info);
e->u.s.info=luaK_codeABC(fs,OP_GETTABLE,0,e->u.s.info,e->u.s.aux);
e->k=VRELOCABLE;
break;
}
case VVARARG:
case VCALL:{
luaK_setoneret(fs,e);
break;
}
default:break;
}
}